

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O1

string * __thiscall
helics::GlobalTimeCoordinator::printTimeStatus_abi_cxx11_
          (string *__return_storage_ptr__,GlobalTimeCoordinator *this)

{
  long lVar1;
  long lVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  double local_28 [2];
  double local_18;
  
  lVar1 = (this->currentMinTime).internalTimeCode;
  lVar2 = (this->nextEvent).internalTimeCode;
  local_28[0] = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  local_18 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  fmt.size_ = 0xaa;
  fmt.data_ = (char *)0x1b;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_28;
  ::fmt::v11::vformat_abi_cxx11_
            (__return_storage_ptr__,(v11 *)"{{\"time_next\":{}, \"Te\":{}}}",fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string GlobalTimeCoordinator::printTimeStatus() const
{
    return fmt::format(R"raw({{"time_next":{}, "Te":{}}})raw",
                       static_cast<double>(currentMinTime),
                       static_cast<double>(nextEvent));
}